

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.h
# Opt level: O1

char * __thiscall
btConeTwistConstraint::serialize
          (btConeTwistConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  btScalar bVar1;
  btScalar bVar2;
  btScalar bVar3;
  int i_2;
  btTransform *pbVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  pbVar4 = &this->m_rbAFrame;
  lVar5 = (long)dataBuffer + 0x40;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      *(btScalar *)(lVar5 + lVar7 * 4) = (pbVar4->m_basis).m_el[0].m_floats[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x10;
    pbVar4 = (btTransform *)((pbVar4->m_basis).m_el + 1);
  } while (lVar6 != 3);
  lVar5 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar5 * 4 + 0x70) = (this->m_rbAFrame).m_origin.m_floats[lVar5]
    ;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  pbVar4 = &this->m_rbBFrame;
  lVar5 = (long)dataBuffer + 0x80;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      *(btScalar *)(lVar5 + lVar7 * 4) = (pbVar4->m_basis).m_el[0].m_floats[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x10;
    pbVar4 = (btTransform *)((pbVar4->m_basis).m_el + 1);
  } while (lVar6 != 3);
  lVar5 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar5 * 4 + 0xb0) = (this->m_rbBFrame).m_origin.m_floats[lVar5]
    ;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  bVar2 = this->m_swingSpan2;
  bVar3 = this->m_twistSpan;
  bVar1 = this->m_limitSoftness;
  *(btScalar *)((long)dataBuffer + 0xc0) = this->m_swingSpan1;
  *(btScalar *)((long)dataBuffer + 0xc4) = bVar2;
  *(btScalar *)((long)dataBuffer + 200) = bVar3;
  *(btScalar *)((long)dataBuffer + 0xcc) = bVar1;
  *(undefined8 *)((long)dataBuffer + 0xd0) = *(undefined8 *)&this->m_biasFactor;
  *(btScalar *)((long)dataBuffer + 0xd8) = this->m_damping;
  return "btConeTwistConstraintData";
}

Assistant:

SIMD_FORCE_INLINE const char*	btConeTwistConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btConeTwistConstraintData2* cone = (btConeTwistConstraintData2*) dataBuffer;
	btTypedConstraint::serialize(&cone->m_typeConstraintData,serializer);

	m_rbAFrame.serialize(cone->m_rbAFrame);
	m_rbBFrame.serialize(cone->m_rbBFrame);
	
	cone->m_swingSpan1 = m_swingSpan1;
	cone->m_swingSpan2 = m_swingSpan2;
	cone->m_twistSpan = m_twistSpan;
	cone->m_limitSoftness = m_limitSoftness;
	cone->m_biasFactor = m_biasFactor;
	cone->m_relaxationFactor = m_relaxationFactor;
	cone->m_damping = m_damping;

	return btConeTwistConstraintDataName;
}